

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int ipc_helper_send_zero(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  undefined8 *__size;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_38;
  code *pcStack_30;
  long local_28;
  long local_20;
  uv_buf_t local_18;
  
  iVar4 = (int)&local_28;
  pcStack_30 = (code *)0x1a7526;
  local_18 = uv_buf_init((char *)0x0,0);
  pcStack_30 = (code *)0x1a7535;
  puVar2 = uv_default_loop();
  pcStack_30 = (code *)0x1a7546;
  iVar1 = uv_pipe_init(puVar2,&channel,0);
  local_20 = (long)iVar1;
  local_28 = 0;
  if (local_20 == 0) {
    pcStack_30 = (code *)0x1a7575;
    uv_pipe_open(&channel,0);
    local_20 = 1;
    pcStack_30 = (code *)0x1a7586;
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    local_28 = (long)iVar1;
    if (local_20 != local_28) goto LAB_001a76e5;
    local_20 = 1;
    pcStack_30 = (code *)0x1a75b0;
    iVar1 = uv_is_writable((uv_stream_t *)&channel);
    local_28 = (long)iVar1;
    if (local_20 != local_28) goto LAB_001a76f2;
    pcStack_30 = (code *)0x1a75d1;
    iVar1 = uv_is_closing((uv_handle_t *)&channel);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001a76ff;
    pcStack_30 = (code *)0x1a7613;
    iVar1 = uv_write(&write_req,(uv_stream_t *)&channel,&local_18,1,send_zero_write_cb);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001a770c;
    pcStack_30 = (code *)0x1a7636;
    puVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1a7640;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001a7719;
    local_20 = 1;
    local_28 = (long)send_zero_write;
    if (local_28 == 1) {
      pcStack_30 = (code *)0x1a7686;
      puVar2 = uv_default_loop();
      pcStack_30 = (code *)0x1a769a;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      pcStack_30 = (code *)0x1a76a4;
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_20 = 0;
      pcStack_30 = (code *)0x1a76b2;
      puVar2 = uv_default_loop();
      pcStack_30 = (code *)0x1a76ba;
      iVar1 = uv_loop_close(puVar2);
      local_28 = (long)iVar1;
      if (local_20 == local_28) {
        pcStack_30 = (code *)0x1a76d0;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001a7733;
    }
  }
  else {
    pcStack_30 = (code *)0x1a76e5;
    ipc_helper_send_zero_cold_1();
LAB_001a76e5:
    pcStack_30 = (code *)0x1a76f2;
    ipc_helper_send_zero_cold_2();
LAB_001a76f2:
    pcStack_30 = (code *)0x1a76ff;
    ipc_helper_send_zero_cold_3();
LAB_001a76ff:
    pcStack_30 = (code *)0x1a770c;
    ipc_helper_send_zero_cold_4();
LAB_001a770c:
    pcStack_30 = (code *)0x1a7719;
    ipc_helper_send_zero_cold_5();
LAB_001a7719:
    pcStack_30 = (code *)0x1a7726;
    ipc_helper_send_zero_cold_6();
  }
  pcStack_30 = (code *)0x1a7733;
  ipc_helper_send_zero_cold_7();
LAB_001a7733:
  pcStack_30 = send_zero_write_cb;
  ipc_helper_send_zero_cold_8();
  pcStack_30 = (code *)(long)iVar4;
  uStack_38 = 0;
  if (pcStack_30 == (code *)0x0) {
    send_zero_write = send_zero_write + 1;
    return iVar4;
  }
  __size = &uStack_38;
  send_zero_write_cb_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return (int)pvVar3;
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT_OK(r);

  uv_pipe_open(&channel, UV_STDIN_FD);

  ASSERT_EQ(1, uv_is_readable((uv_stream_t*) &channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*) &channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, send_zero_write);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}